

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

size_t __thiscall
google::protobuf::hash<google::protobuf::MapKey>::operator()
          (hash<google::protobuf::MapKey> *this,MapKey *map_key)

{
  bool bVar1;
  CppType CVar2;
  uint32 uVar3;
  int32 iVar4;
  LogMessage *pLVar5;
  uint64 uVar6;
  string *psVar7;
  size_t sVar8;
  char *pcVar9;
  char cVar10;
  LogFinisher local_41;
  LogMessage local_40;
  
  CVar2 = MapKey::type(map_key);
  switch(CVar2) {
  case CPPTYPE_INT32:
    iVar4 = MapKey::GetInt32Value(map_key);
    sVar8 = (size_t)iVar4;
    break;
  case CPPTYPE_INT64:
    sVar8 = MapKey::GetInt64Value(map_key);
    return sVar8;
  case CPPTYPE_UINT32:
    uVar3 = MapKey::GetUInt32Value(map_key);
    sVar8 = (size_t)uVar3;
    break;
  case CPPTYPE_UINT64:
    uVar6 = MapKey::GetUInt64Value(map_key);
    return uVar6;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x310);
    pLVar5 = internal::LogMessage::operator<<(&local_40,"Unsupported");
    internal::LogFinisher::operator=(&local_41,pLVar5);
    internal::LogMessage::~LogMessage(&local_40);
  default:
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,799);
    pLVar5 = internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_41,pLVar5);
    internal::LogMessage::~LogMessage(&local_40);
LAB_00327d1b:
    sVar8 = 0;
    break;
  case CPPTYPE_BOOL:
    bVar1 = MapKey::GetBoolValue(map_key);
    sVar8 = (size_t)bVar1;
    break;
  case CPPTYPE_STRING:
    psVar7 = MapKey::GetStringValue_abi_cxx11_(map_key);
    pcVar9 = (psVar7->_M_dataplus)._M_p;
    cVar10 = *pcVar9;
    if (cVar10 != '\0') {
      sVar8 = 0;
      do {
        pcVar9 = pcVar9 + 1;
        sVar8 = (long)cVar10 + sVar8 * 5;
        cVar10 = *pcVar9;
      } while (cVar10 != '\0');
      return sVar8;
    }
    goto LAB_00327d1b;
  }
  return sVar8;
}

Assistant:

size_t
  operator()(const google::protobuf::MapKey& map_key) const {
    switch (map_key.type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        return hash<string>()(map_key.GetStringValue());
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        return hash< ::google::protobuf::int64>()(map_key.GetInt64Value());
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        return hash< ::google::protobuf::int32>()(map_key.GetInt32Value());
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        return hash< ::google::protobuf::uint64>()(map_key.GetUInt64Value());
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        return hash< ::google::protobuf::uint32>()(map_key.GetUInt32Value());
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        return hash<bool>()(map_key.GetBoolValue());
    }
    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }